

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::CompileByteMap(int iters,string *regexp)

{
  Prog *pPVar1;
  ostream *poVar2;
  int local_34c;
  undefined1 local_348 [4];
  int i;
  Prog *local_1c8;
  Prog *prog;
  LogMessage local_1b0;
  StringPiece local_30;
  Regexp *local_20;
  Regexp *re;
  string *regexp_local;
  int iters_local;
  
  re = (Regexp *)regexp;
  regexp_local._4_4_ = iters;
  StringPiece::StringPiece(&local_30,regexp);
  local_20 = Regexp::Parse(&local_30,LikePerl,(RegexpStatus *)0x0);
  if (local_20 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x2c3);
    poVar2 = LogMessage::stream(&local_1b0);
    std::operator<<(poVar2,"Check failed: re");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  local_1c8 = Regexp::CompileToProg(local_20,0);
  if (local_1c8 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x2c5);
    poVar2 = LogMessage::stream((LogMessage *)local_348);
    std::operator<<(poVar2,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_348);
  }
  for (local_34c = 0; pPVar1 = local_1c8, local_34c < regexp_local._4_4_; local_34c = local_34c + 1)
  {
    Prog::ComputeByteMap(local_1c8);
  }
  if (local_1c8 != (Prog *)0x0) {
    Prog::~Prog(local_1c8);
    operator_delete(pPVar1);
  }
  Regexp::Decref(local_20);
  return;
}

Assistant:

void CompileByteMap(int iters, const string& regexp) {
  Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
  CHECK(re);
  Prog* prog = re->CompileToProg(0);
  CHECK(prog);
  for (int i = 0; i < iters; i++) {
    prog->ComputeByteMap();
  }
  delete prog;
  re->Decref();
}